

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

Vector3f __thiscall
pbrt::PortalImageInfiniteLight::RenderFromImage
          (PortalImageInfiniteLight *this,Point2f *st,Float *duv_dw)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  Tuple3<pbrt::Vector3,_float> TVar8;
  Tuple3<pbrt::Vector3,_float> local_28;
  Vector3<float> local_1c;
  undefined1 auVar6 [56];
  
  auVar2 = vfmadd132ss_fma(ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).x),
                           SUB6416(ZEXT464(0xbfc90fdb),0),SUB6416(ZEXT464(0x40490fdb),0));
  auVar1 = vfmadd132ss_fma(SUB6416(ZEXT464(0x40490fdb),0),SUB6416(ZEXT464(0xbfc90fdb),0),
                           ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).y));
  fVar3 = tanf(auVar2._0_4_);
  local_1c.super_Tuple3<pbrt::Vector3,_float>.y = tanf(auVar1._0_4_);
  local_1c.super_Tuple3<pbrt::Vector3,_float>.z = -1.0;
  auVar6 = extraout_var;
  local_1c.super_Tuple3<pbrt::Vector3,_float>.x = fVar3;
  VVar7 = Normalize<float>(&local_1c);
  local_28.z = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  auVar2 = auVar5._0_16_;
  local_28._0_8_ = vmovlps_avx(auVar2);
  if ((local_28.z == 0.0) && (!NAN(local_28.z))) {
    local_28.z = 1e-05;
  }
  if (duv_dw != (Float *)0x0) {
    auVar1._8_4_ = 0x3f800000;
    auVar1._0_8_ = 0x3f8000003f800000;
    auVar1._12_4_ = 0x3f800000;
    auVar1 = vfnmadd213ps_avx512vl(auVar2,auVar2,auVar1);
    auVar2 = vmovshdup_avx(auVar1);
    auVar4._0_4_ = (auVar2._0_4_ * auVar1._0_4_) / local_28.z;
    auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar2 = vandps_avx512vl(auVar4,auVar2);
    *duv_dw = auVar2._0_4_ * 9.869605;
  }
  TVar8 = (Tuple3<pbrt::Vector3,_float>)Frame::FromLocal(&this->portalFrame,(Vector3f *)&local_28);
  return (Vector3f)TVar8;
}

Assistant:

PBRT_CPU_GPU
    Vector3f RenderFromImage(const Point2f &st, Float *duv_dw = nullptr) const {
        Float alpha = -Pi / 2 + st.x * Pi, beta = -Pi / 2 + st.y * Pi;
        Float x = std::tan(alpha), y = std::tan(beta);
        DCHECK(!IsInf(x) && !IsInf(y));
        Vector3f w = Normalize(Vector3f(x, y, -1));

        if (w.z == 0)
            w.z = 1e-5;
        if (duv_dw)
            *duv_dw = Pi * Pi * std::abs((1 - w.y * w.y) * (1 - w.x * w.x) / w.z);
        return portalFrame.FromLocal(w);
    }